

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O2

matroska_block * CopyBlockInfo(matroska_block *Element)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool_t bVar3;
  void *pvVar4;
  matroska_block *pmVar5;
  
  if (Element != (matroska_block *)0x0) {
    pvVar4 = Node_InheritedVMT((node *)Element,
                               *(fourcc_t *)((long)(Element->Base).Base.Base.Base.VMT + 8));
    pmVar5 = (matroska_block *)(**(code **)((long)pvVar4 + 0xb0))(Element);
    if (pmVar5 != (matroska_block *)0x0) {
      pmVar5->TrackNumber = Element->TrackNumber;
      uVar1 = *(undefined4 *)((long)&Element->IsKeyframe + 4);
      bVar3 = Element->IsDiscardable;
      uVar2 = *(undefined4 *)((long)&Element->IsDiscardable + 4);
      *(int *)&pmVar5->IsKeyframe = (int)Element->IsKeyframe;
      *(undefined4 *)((long)&pmVar5->IsKeyframe + 4) = uVar1;
      *(int *)&pmVar5->IsDiscardable = (int)bVar3;
      *(undefined4 *)((long)&pmVar5->IsDiscardable + 4) = uVar2;
      pmVar5->Invisible = Element->Invisible;
      (pmVar5->Base).Base.bValueIsSet = '\0';
      (**(code **)((long)(pmVar5->Base).Base.Base.Base.VMT + 0x20))
                (pmVar5,0x180,&Element->ReadTrack,8);
      (**(code **)((long)(pmVar5->Base).Base.Base.Base.VMT + 0x20))
                (pmVar5,0x181,&Element->ReadSegInfo,8);
      (**(code **)((long)(pmVar5->Base).Base.Base.Base.VMT + 0x20))
                (pmVar5,0x182,&Element->WriteTrack,8);
      (**(code **)((long)(pmVar5->Base).Base.Base.Base.VMT + 0x20))
                (pmVar5,0x183,&Element->WriteSegInfo,8);
    }
    return pmVar5;
  }
  __assert_fail("(const void*)(Element)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                ,0x77f,"matroska_block *CopyBlockInfo(const matroska_block *)");
}

Assistant:

static matroska_block *CopyBlockInfo(const matroska_block *Element)
{
    matroska_block *Result = (matroska_block*)INHERITED(Element,ebml_element_vmt,Node_ClassId(Element))->Copy(Element);
    if (Result)
    {
        Result->TrackNumber = Element->TrackNumber;
        Result->IsKeyframe = Element->IsKeyframe;
        Result->IsDiscardable = Element->IsDiscardable;
        Result->Invisible = Element->Invisible;
#if 0 // computed once blocks are added
        Result->LocalTimestamp = Element->LocalTimestamp;
        Result->LocalTimestampUsed = Element->LocalTimestampUsed;
        Result->GlobalTimestamp = Element->GlobalTimestamp;
        Result->Lacing = Element->Lacing;
        Result->FirstFrameLocation = Element->FirstFrameLocation;
        array SizeList = Element->; // int32_t
        array Data = Element->; // uint8_t
        array Durations = Element->; // mkv_timestamp_t
#else
        Result->Base.Base.bValueIsSet = 0;
#endif
        Node_SET(Result,MATROSKA_BLOCK_READ_TRACK,&Element->ReadTrack);
        Node_SET(Result,MATROSKA_BLOCK_READ_SEGMENTINFO,&Element->ReadSegInfo);
#if defined(CONFIG_EBML_WRITING)
        Node_SET(Result,MATROSKA_BLOCK_WRITE_TRACK,&Element->WriteTrack);
        Node_SET(Result,MATROSKA_BLOCK_WRITE_SEGMENTINFO,&Element->WriteSegInfo);
#endif
    }
    return Result;
}